

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O3

bool bssl::ssl_setup_key_shares(SSL_HANDSHAKE *hs,uint16_t override_group_id)

{
  UniquePtr<SSLKeyShare> *this;
  UniquePtr<SSLKeyShare> *this_00;
  SSL *pSVar1;
  SSLKeyShare *pSVar2;
  __uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> _Var3;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  ulong uVar7;
  uint16_t *puVar8;
  ulong uVar9;
  ScopedCBB cbb;
  CBB key_exchange;
  __uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> local_98;
  CBB local_90;
  CBB local_60;
  
  pSVar1 = hs->ssl;
  this = hs->key_shares;
  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)this,(pointer)0x0);
  this_00 = hs->key_shares + 1;
  std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)this_00,(pointer)0x0);
  OPENSSL_free((hs->key_share_bytes).data_);
  (hs->key_share_bytes).data_ = (uchar *)0x0;
  (hs->key_share_bytes).size_ = 0;
  if (hs->max_version < 0x304) {
    return true;
  }
  if ((hs->pake_prover)._M_t.
      super___uniq_ptr_impl<bssl::spake2plus::Prover,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_bssl::spake2plus::Prover_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_bssl::spake2plus::Prover_*,_false>._M_head_impl != (Prover *)0x0) {
    return true;
  }
  CBB_zero(&local_90);
  iVar6 = CBB_init(&local_90,0x40);
  if (iVar6 != 0) {
    if (override_group_id == 0) {
      if ((((pSVar1->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->field_0x288 & 0x20) != 0) {
        uVar5 = ssl_get_grease_value(hs,ssl_grease_group);
        iVar6 = CBB_add_u16(&local_90,uVar5);
        if (((iVar6 == 0) || (iVar6 = CBB_add_u16(&local_90,1), iVar6 == 0)) ||
           (iVar6 = CBB_add_u8(&local_90,'\0'), iVar6 == 0)) goto LAB_0013847b;
      }
      uVar7 = (hs->config->supported_group_list).size_;
      if (uVar7 == 0) {
        uVar7 = 3;
        puVar8 = &kDefaultGroups;
        override_group_id = 0x1d;
      }
      else {
        puVar8 = (hs->config->supported_group_list).data_;
        override_group_id = *puVar8;
        if (uVar7 == 1) goto LAB_001382f8;
      }
      uVar9 = 2;
      do {
        uVar5 = puVar8[uVar9 - 1];
        if ((override_group_id == 0x11ec || override_group_id == 0x6399) ==
            (uVar5 == 0x11ec || uVar5 == 0x6399)) {
          uVar5 = 0;
        }
        else if (uVar5 == override_group_id) {
          __assert_fail("second_group_id != group_id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                        ,0x8c2,"bool bssl::ssl_setup_key_shares(SSL_HANDSHAKE *, uint16_t)");
        }
      } while ((uVar5 == 0) && (bVar4 = uVar9 < uVar7, uVar9 = uVar9 + 1, bVar4));
    }
    else {
LAB_001382f8:
      uVar5 = 0;
    }
    SSLKeyShare::Create((SSLKeyShare *)&local_98,override_group_id);
    _Var3._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl =
         local_98._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl;
    local_98._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl =
         (tuple<bssl::SSLKeyShare_*,_bssl::internal::Deleter>)
         (_Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>)0x0;
    std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)this,
               (pointer)_Var3._M_t.
                        super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                        super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl);
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&local_98);
    if ((((this->_M_t).super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl != (SSLKeyShare *)0x0) &&
        (iVar6 = CBB_add_u16(&local_90,override_group_id), iVar6 != 0)) &&
       ((iVar6 = CBB_add_u16_length_prefixed(&local_90,&local_60), iVar6 != 0 &&
        (pSVar2 = (this->_M_t).super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>.
                  _M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl,
        iVar6 = (*pSVar2->_vptr_SSLKeyShare[3])(pSVar2,&local_60), (char)iVar6 != '\0')))) {
      if (uVar5 != 0) {
        SSLKeyShare::Create((SSLKeyShare *)&local_98,uVar5);
        _Var3._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl =
             local_98._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl;
        local_98._M_t.super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl =
             (tuple<bssl::SSLKeyShare_*,_bssl::internal::Deleter>)
             (_Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>)0x0;
        std::__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>::reset
                  ((__uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter> *)this_00,
                   (pointer)_Var3._M_t.
                            super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                            super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl);
        std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)&local_98);
        if (((((((tuple<bssl::SSLKeyShare_*,_bssl::internal::Deleter> *)&this_00->_M_t)->
               super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>).
               super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl == (SSLKeyShare *)0x0)
             || (iVar6 = CBB_add_u16(&local_90,uVar5), iVar6 == 0)) ||
            (iVar6 = CBB_add_u16_length_prefixed(&local_90,&local_60), iVar6 == 0)) ||
           (pSVar2 = (((tuple<bssl::SSLKeyShare_*,_bssl::internal::Deleter> *)&this_00->_M_t)->
                     super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>).
                     super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl,
           iVar6 = (*pSVar2->_vptr_SSLKeyShare[3])(pSVar2,&local_60), (char)iVar6 == '\0'))
        goto LAB_0013847b;
      }
      bVar4 = CBBFinishArray(&local_90,&hs->key_share_bytes);
      goto LAB_0013847e;
    }
  }
LAB_0013847b:
  bVar4 = false;
LAB_0013847e:
  CBB_cleanup(&local_90);
  return bVar4;
}

Assistant:

bool ssl_setup_key_shares(SSL_HANDSHAKE *hs, uint16_t override_group_id) {
  SSL *const ssl = hs->ssl;
  hs->key_shares[0].reset();
  hs->key_shares[1].reset();
  hs->key_share_bytes.Reset();

  // If offering a PAKE, do not set up key shares. We do not currently support
  // clients offering both PAKE and non-PAKE modes, including resumption.
  if (hs->max_version < TLS1_3_VERSION || hs->pake_prover) {
    return true;
  }

  bssl::ScopedCBB cbb;
  if (!CBB_init(cbb.get(), 64)) {
    return false;
  }

  if (override_group_id == 0 && ssl->ctx->grease_enabled) {
    // Add a fake group. See RFC 8701.
    if (!CBB_add_u16(cbb.get(), ssl_get_grease_value(hs, ssl_grease_group)) ||
        !CBB_add_u16(cbb.get(), 1 /* length */) ||
        !CBB_add_u8(cbb.get(), 0 /* one byte key share */)) {
      return false;
    }
  }

  uint16_t group_id = override_group_id;
  uint16_t second_group_id = 0;
  if (override_group_id == 0) {
    // Predict the most preferred group.
    Span<const uint16_t> groups = tls1_get_grouplist(hs);
    if (groups.empty()) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_NO_GROUPS_SPECIFIED);
      return false;
    }

    group_id = groups[0];

    // We'll try to include one post-quantum and one classical initial key
    // share.
    for (size_t i = 1; i < groups.size() && second_group_id == 0; i++) {
      if (is_post_quantum_group(group_id) != is_post_quantum_group(groups[i])) {
        second_group_id = groups[i];
        assert(second_group_id != group_id);
      }
    }
  }

  CBB key_exchange;
  hs->key_shares[0] = SSLKeyShare::Create(group_id);
  if (!hs->key_shares[0] ||  //
      !CBB_add_u16(cbb.get(), group_id) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &key_exchange) ||
      !hs->key_shares[0]->Generate(&key_exchange)) {
    return false;
  }

  if (second_group_id != 0) {
    hs->key_shares[1] = SSLKeyShare::Create(second_group_id);
    if (!hs->key_shares[1] ||  //
        !CBB_add_u16(cbb.get(), second_group_id) ||
        !CBB_add_u16_length_prefixed(cbb.get(), &key_exchange) ||
        !hs->key_shares[1]->Generate(&key_exchange)) {
      return false;
    }
  }

  return CBBFinishArray(cbb.get(), &hs->key_share_bytes);
}